

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteUnwindTryCatchStack(CWriter *this,Label *label)

{
  size_type sVar1;
  Newline local_21;
  reference local_20;
  string *name;
  Label *label_local;
  CWriter *this_local;
  
  name = (string *)label;
  label_local = (Label *)this;
  sVar1 = std::
          vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
          ::size(&this->try_catch_stack_);
  if (*(ulong *)(name + 1) <= sVar1) {
    sVar1 = std::
            vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
            ::size(&this->try_catch_stack_);
    if (sVar1 != *(size_type *)(name + 1)) {
      local_20 = std::
                 vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
                 ::at(&this->try_catch_stack_,*(size_type *)(name + 1));
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [27])"wasm_rt_set_unwind_target(",&local_20->name,
                 (char (*) [16])"_outer_target);",&local_21);
    }
    return;
  }
  __assert_fail("try_catch_stack_.size() >= label->try_catch_stack_size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xbdc,
                "void wabt::(anonymous namespace)::CWriter::WriteUnwindTryCatchStack(const Label *)"
               );
}

Assistant:

void CWriter::WriteUnwindTryCatchStack(const Label* label) {
  assert(try_catch_stack_.size() >= label->try_catch_stack_size);

  if (try_catch_stack_.size() != label->try_catch_stack_size) {
    const std::string& name =
        try_catch_stack_.at(label->try_catch_stack_size).name;

    Write("wasm_rt_set_unwind_target(", name, "_outer_target);", Newline());
  }
}